

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O3

void __thiscall Assimp::FBX::LineGeometry::~LineGeometry(LineGeometry *this)

{
  ~LineGeometry(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

LineGeometry::~LineGeometry() {
    // empty
}